

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O3

void helper_xsrqpi(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xt,ppc_vsr_t *xb)

{
  uint8_t *puVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  float128 arg;
  float128 fVar8;
  uintptr_t unaff_retaddr;
  float_status tstat;
  
  uVar6 = opcode >> 0x10 & 1;
  uVar5 = opcode >> 9 & 3;
  (env->fp_status).float_exception_flags = '\0';
  bVar3 = 4;
  if (uVar6 != 0 || uVar5 != 0) {
    if (uVar5 == 3 && uVar6 == 0) {
      bVar3 = (byte)env->fpscr & 3;
    }
    else if (uVar6 == 0) {
      bVar3 = 0;
    }
    else {
      bVar3 = (byte)(0x1020300 >> (sbyte)(uVar5 << 3));
    }
  }
  tstat._0_2_ = CONCAT11(bVar3,(env->fp_status).float_detect_tininess);
  tstat = (float_status)(CONCAT62(SUB86(env->fp_status,2),tstat._0_2_) & 0xffffffffff00ffff);
  fVar8 = float128_round_to_int_ppc(xb->f128,&tstat);
  uVar7 = fVar8.high;
  puVar1 = &(env->fp_status).float_exception_flags;
  *puVar1 = *puVar1 | tstat.float_exception_flags;
  if (((ulong)tstat & 0x10000) != 0) {
    iVar4 = float128_is_signaling_nan_ppc(xb->f128,&tstat);
    if (iVar4 != 0) {
      pbVar2 = (byte *)((long)&env->fpscr + 3);
      *pbVar2 = *pbVar2 | 1;
      finish_invalid_op_excp(env,5,unaff_retaddr);
      uVar7 = uVar7 | 0x800000000000;
    }
  }
  if (((opcode & 1) == 0) && (((ulong)tstat & 0x200000) != 0)) {
    puVar1 = &(env->fp_status).float_exception_flags;
    *puVar1 = *puVar1 & 0xdf;
  }
  arg.high = uVar7;
  arg.low = fVar8.low;
  uVar6 = float128_classify(arg);
  uVar5 = 0;
  if (uVar6 != 0) {
    for (; (uVar6 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
    }
  }
  env->fpscr = (uint)(byte)set_fprf_from_class_fprf[(ulong)(uVar6 >> 6) + (ulong)uVar5 * 2] << 0xc |
               env->fpscr & 0xfffe0fff;
  do_float_check_status(env,unaff_retaddr);
  xt->u64[0] = fVar8.low;
  xt->u64[1] = uVar7;
  return;
}

Assistant:

void helper_xsrqpi(CPUPPCState *env, uint32_t opcode,
                   ppc_vsr_t *xt, ppc_vsr_t *xb)
{
    ppc_vsr_t t = { 0 };
    uint8_t r = Rrm(opcode);
    uint8_t ex = Rc(opcode);
    uint8_t rmc = RMC(opcode);
    uint8_t rmode = 0;
    float_status tstat;

    helper_reset_fpstatus(env);

    if (r == 0 && rmc == 0) {
        rmode = float_round_ties_away;
    } else if (r == 0 && rmc == 0x3) {
        rmode = fpscr_rn;
    } else if (r == 1) {
        switch (rmc) {
        case 0:
            rmode = float_round_nearest_even;
            break;
        case 1:
            rmode = float_round_to_zero;
            break;
        case 2:
            rmode = float_round_up;
            break;
        case 3:
            rmode = float_round_down;
            break;
        default:
            abort();
        }
    }

    tstat = env->fp_status;
    set_float_exception_flags(0, &tstat);
    set_float_rounding_mode(rmode, &tstat);
    t.f128 = float128_round_to_int(xb->f128, &tstat);
    env->fp_status.float_exception_flags |= tstat.float_exception_flags;

    if (unlikely(tstat.float_exception_flags & float_flag_invalid)) {
        if (float128_is_signaling_nan(xb->f128, &tstat)) {
            float_invalid_op_vxsnan(env, GETPC());
            t.f128 = float128_snan_to_qnan(t.f128);
        }
    }

    if (ex == 0 && (tstat.float_exception_flags & float_flag_inexact)) {
        env->fp_status.float_exception_flags &= ~float_flag_inexact;
    }

    helper_compute_fprf_float128(env, t.f128);
    do_float_check_status(env, GETPC());
    *xt = t;
}